

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,StackVar *t,char (*u) [4],char **args,char (*args_1) [2],
          ExternalInstancePtr *args_2,char (*args_3) [9],StackVar *args_4,char (*args_5) [2])

{
  char *__s;
  size_t size;
  StackVar *args_00;
  char (*args_1_00) [2];
  
  args_00 = (StackVar *)args;
  args_1_00 = args_1;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this," = ",3);
  __s = *(char **)u;
  size = strlen(__s);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,__s,size);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"(",1);
  Write<wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            (this,(ExternalInstancePtr *)args,(char (*) [9])args_1,args_00,args_1_00);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }